

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

void __thiscall
testing::Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
::Action(Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
         *this,ActionInterface<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>
               *impl)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::ActionInterface<int(std::unique_ptr<SDL_Renderer,std::function<void(SDL_Renderer*)>>const&)>*>
            (&local_10,impl);
  (this->fun_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->fun_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->fun_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->fun_).super__Function_base._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = impl;
  puVar1[1] = 0;
  puVar1[1] = local_10._M_pi;
  *(undefined8 **)&(this->fun_).super__Function_base._M_functor = puVar1;
  (this->fun_)._M_invoker =
       std::
       _Function_handler<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&),_testing::Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::ActionAdapter>
       ::_M_invoke;
  (this->fun_).super__Function_base._M_manager =
       std::
       _Function_handler<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&),_testing::Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&)>::ActionAdapter>
       ::_M_manager;
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}